

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

float tcu::sampleCubeSeamlessLinearCompare
                (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,Sampler *sampler,
                float ref,float s,float t)

{
  int *piVar1;
  WrapMode WVar2;
  ConstPixelBufferAccess *pCVar3;
  int i_1;
  TextureChannelClass TVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int i;
  int iVar8;
  long lVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  CubeFaceIntCoords CVar17;
  float sampleRes [4];
  bool hasBothCoordsOutOfBounds [4];
  IVec2 baseSampleCoords [4];
  float local_d8;
  float local_98 [6];
  float local_80;
  char acStack_7c [4];
  ConstPixelBufferAccess local_78;
  int local_50;
  int local_4c;
  ConstPixelBufferAccess (*local_40) [6];
  Sampler *local_38;
  
  iVar6 = (*faceAccesses)[0].m_size.m_data[0];
  fVar11 = s;
  local_d8 = t;
  local_40 = faceAccesses;
  local_38 = sampler;
  if (sampler->normalizedCoords == true) {
    WVar2 = sampler->wrapS;
    fVar11 = 0.0;
    if (WVar2 < WRAPMODE_LAST) {
      fVar11 = (float)iVar6;
      if ((0x57U >> (WVar2 & 0x1f) & 1) == 0) {
        if (WVar2 == REPEAT_CL) {
          fVar14 = floorf(s);
          fVar11 = (s - fVar14) * fVar11;
        }
        else {
          fVar14 = s * 0.5;
          fVar12 = floorf(fVar14);
          if ((fVar14 - fVar12 != 0.5) || (NAN(fVar14 - fVar12))) {
            fVar12 = floorf(fVar14 + 0.5);
          }
          else {
            fVar12 = 0.0;
            if (((long)(fVar14 + -0.5) & 1U) != 0) {
              fVar12 = 1.0;
            }
            fVar12 = fVar14 + -0.5 + fVar12;
          }
          fVar14 = s - (fVar12 + fVar12);
          uVar10 = -(uint)(-fVar14 <= fVar14);
          fVar11 = (float)(~uVar10 & (uint)-fVar14 | (uint)fVar14 & uVar10) * fVar11;
        }
      }
      else {
        fVar11 = fVar11 * s;
      }
    }
    WVar2 = sampler->wrapT;
    if (WVar2 < WRAPMODE_LAST) {
      if ((0x57U >> (WVar2 & 0x1f) & 1) == 0) {
        if (WVar2 == REPEAT_CL) {
          fVar14 = floorf(t);
          local_d8 = (t - fVar14) * (float)iVar6;
        }
        else {
          fVar14 = t * 0.5;
          fVar12 = floorf(fVar14);
          if ((fVar14 - fVar12 != 0.5) || (NAN(fVar14 - fVar12))) {
            fVar12 = floorf(fVar14 + 0.5);
          }
          else {
            fVar12 = 0.0;
            if (((long)(fVar14 + -0.5) & 1U) != 0) {
              fVar12 = 1.0;
            }
            fVar12 = fVar14 + -0.5 + fVar12;
          }
          fVar14 = t - (fVar12 + fVar12);
          uVar10 = -(uint)(-fVar14 <= fVar14);
          local_d8 = (float)(~uVar10 & (uint)-fVar14 | (uint)fVar14 & uVar10) * (float)iVar6;
        }
      }
      else {
        local_d8 = t * (float)iVar6;
      }
    }
    else {
      local_d8 = 0.0;
    }
  }
  fVar12 = floorf(fVar11 + -0.5);
  iVar8 = (int)fVar12;
  local_80 = floorf(local_d8 + -0.5);
  local_78.m_pitch.m_data[0] = (int)local_80;
  local_78.m_size.m_data[2] = iVar8;
  local_78.m_pitch.m_data[1] = iVar8 + 1;
  local_78.m_pitch.m_data[2] = local_78.m_pitch.m_data[0];
  local_78.m_data._0_4_ = iVar8;
  local_78.m_data._4_4_ = local_78.m_pitch.m_data[0] + 1;
  local_50 = iVar8 + 1;
  local_4c = local_78.m_pitch.m_data[0] + 1;
  fVar14 = 1.0;
  if (ref <= 1.0) {
    fVar14 = ref;
  }
  lVar9 = 0;
  do {
    local_78.m_format.order = baseFace;
    piVar1 = local_78.m_pitch.m_data + lVar9 * 2 + -1;
    local_78.m_format.type = piVar1[0];
    local_78.m_size.m_data[0] = piVar1[1];
    CVar17 = remapCubeEdgeCoords((CubeFaceIntCoords *)&local_78,iVar6);
    uVar5 = CVar17._0_8_ & 0xffffffff;
    acStack_7c[lVar9] = uVar5 == 6;
    if (uVar5 != 6) {
      pCVar3 = *local_40;
      TVar4 = getTextureChannelClass(pCVar3[uVar5].m_format.type);
      ConstPixelBufferAccess::getPixel(&local_78,(int)(pCVar3 + uVar5),CVar17.s,CVar17.t);
      fVar15 = (float)local_78.m_size.m_data[(long)local_38->compareChannel + -2];
      fVar16 = ref;
      if (TVar4 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
        fVar16 = 1.0;
        if (fVar15 <= 1.0) {
          fVar16 = fVar15;
        }
        fVar15 = (float)(~-(uint)(fVar15 < 0.0) & (uint)fVar16);
        fVar16 = (float)(~-(uint)(ref < 0.0) & (uint)fVar14);
      }
      fVar13 = 0.0;
      switch(local_38->compare) {
      case COMPAREMODE_LESS:
        if (fVar16 < fVar15) goto switchD_00a975fa_caseD_7;
        break;
      case COMPAREMODE_LESS_OR_EQUAL:
        if (fVar16 <= fVar15) goto switchD_00a975fa_caseD_7;
        break;
      case COMPAREMODE_GREATER:
        if (fVar15 < fVar16) goto switchD_00a975fa_caseD_7;
        break;
      case COMPAREMODE_GREATER_OR_EQUAL:
        if (fVar15 <= fVar16) goto switchD_00a975fa_caseD_7;
        break;
      case COMPAREMODE_EQUAL:
        if ((fVar16 == fVar15) && (!NAN(fVar16) && !NAN(fVar15))) goto switchD_00a975fa_caseD_7;
        break;
      case COMPAREMODE_NOT_EQUAL:
        if ((fVar16 != fVar15) || (NAN(fVar16) || NAN(fVar15))) goto switchD_00a975fa_caseD_7;
        break;
      case COMPAREMODE_ALWAYS:
switchD_00a975fa_caseD_7:
        fVar13 = 1.0;
      }
      local_98[lVar9] = fVar13;
    }
    lVar9 = lVar9 + 1;
    if (lVar9 == 4) {
      uVar7 = 0xffffffff;
      uVar5 = 0;
      do {
        if (acStack_7c[uVar5] != '\0') {
          uVar7 = uVar5 & 0xffffffff;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 4);
      iVar6 = (int)uVar7;
      if (iVar6 != -1) {
        local_98[iVar6] = 0.0;
        fVar14 = 0.0;
        uVar5 = 0;
        do {
          if (uVar7 != uVar5) {
            fVar14 = fVar14 + local_98[uVar5];
            local_98[iVar6] = fVar14;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 4);
        local_98[iVar6] = fVar14 * 0.33333334;
      }
      fVar12 = (fVar11 + -0.5) - fVar12;
      local_80 = (local_d8 + -0.5) - local_80;
      return fVar12 * local_98[3] * local_80 +
             (1.0 - fVar12) * local_98[2] * local_80 +
             (1.0 - local_80) * local_98[0] * (1.0 - fVar12) +
             local_98[1] * fVar12 * (1.0 - local_80);
    }
  } while( true );
}

Assistant:

static float sampleCubeSeamlessLinearCompare (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, const Sampler& sampler, float ref, float s, float t)
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());

	int		size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float	u		= s;
	float	v		= t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, size);
		v = unnormalize(sampler.wrapT, t, size);
	}

	int			x0						= deFloorFloatToInt32(u-0.5f);
	int			x1						= x0+1;
	int			y0						= deFloorFloatToInt32(v-0.5f);
	int			y1						= y0+1;
	IVec2		baseSampleCoords[4]		=
	{
		IVec2(x0, y0),
		IVec2(x1, y0),
		IVec2(x0, y1),
		IVec2(x1, y1)
	};
	float		sampleRes[4];
	bool		hasBothCoordsOutOfBounds[4]; //!< Whether correctCubeFace() returns CUBEFACE_LAST, i.e. both u and v are out of bounds.

	// Find correct faces and coordinates for out-of-bounds sample coordinates.

	for (int i = 0; i < 4; i++)
	{
		CubeFaceIntCoords coords = remapCubeEdgeCoords(CubeFaceIntCoords(baseFace, baseSampleCoords[i]), size);
		hasBothCoordsOutOfBounds[i] = coords.face == CUBEFACE_LAST;

		if (!hasBothCoordsOutOfBounds[i])
		{
			const bool isFixedPointDepth = isFixedPointDepthTextureFormat(faceAccesses[coords.face].getFormat());

			sampleRes[i] = execCompare(faceAccesses[coords.face].getPixel(coords.s, coords.t), sampler.compare, sampler.compareChannel, ref, isFixedPointDepth);
		}
	}

	// If a sample was out of bounds in both u and v, we get its color from the average of the three other samples.
	// \note This averaging behavior is not required by the GLES3 spec (though it is recommended). GLES3 spec only
	//		 requires that if the three other samples all have the same color, then the doubly-out-of-bounds sample
	//		 must have this color as well.

	{
		int bothOutOfBoundsNdx = -1;
		for (int i = 0; i < 4; i++)
		{
			if (hasBothCoordsOutOfBounds[i])
			{
				DE_ASSERT(bothOutOfBoundsNdx < 0); // Only one sample can be out of bounds in both u and v.
				bothOutOfBoundsNdx = i;
			}
		}
		if (bothOutOfBoundsNdx != -1)
		{
			sampleRes[bothOutOfBoundsNdx] = 0.0f;
			for (int i = 0; i < 4; i++)
				if (i != bothOutOfBoundsNdx)
					sampleRes[bothOutOfBoundsNdx] += sampleRes[i];

			sampleRes[bothOutOfBoundsNdx] = sampleRes[bothOutOfBoundsNdx] * (1.0f/3.0f);
		}
	}

	// Interpolate.

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	return (sampleRes[0]*(1.0f-a)*(1.0f-b)) +
		   (sampleRes[1]*(     a)*(1.0f-b)) +
		   (sampleRes[2]*(1.0f-a)*(     b)) +
		   (sampleRes[3]*(     a)*(     b));
}